

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::base_widget::auto_generate(base_widget *this,form_context *context)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  form_context *extraout_RDX;
  form_context *extraout_RDX_00;
  iterator p;
  iterator e;
  
  if ((this->field_0x1f0 & 0x10) == 0) {
    iVar2 = (*(this->super_base_form)._vptr_base_form[5])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      generate(this,1,extraout_RDX);
      return;
    }
    do {
      iVar2 = (*(this->super_base_form)._vptr_base_form[5])(this);
      this = (base_widget *)CONCAT44(extraout_var_00,iVar2);
      iVar2 = (*(this->super_base_form)._vptr_base_form[5])(this);
    } while (CONCAT44(extraout_var_01,iVar2) != 0);
    form::iterator::iterator(&p,(form *)this);
    form::iterator::iterator(&e);
    iVar2 = 1;
    while( true ) {
      bVar1 = form::iterator::operator!=(&p,&e);
      if (!bVar1) break;
      generate((base_widget *)
               ((p.current_)->elements_).
               super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start[p.offset_ - 1].first,iVar2,extraout_RDX_00)
      ;
      form::iterator::next(&p);
      iVar2 = iVar2 + 1;
    }
    form::iterator::~iterator(&e);
    form::iterator::~iterator(&p);
  }
  return;
}

Assistant:

void base_widget::auto_generate(form_context *context)
{
	if(is_generation_done_)
		return;
	if(parent() == 0) {
		generate(1,context);
		return;
	}
	form *top;
	for(top = parent();top->parent();top=top->parent())
		;
	int i=1;
	form::iterator p=top->begin(),e=top->end();
	while(p!=e) {
		p->generate(i,context);
		++p;
		++i;
	}
}